

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::tfhd::print(tfhd *this)

{
  long lVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"=================tfhd==================");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," vflags                  ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," track id:                  ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6c == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," base_data_offset: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6d == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," sample description: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6e == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," default sample duration: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6f == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," default sample size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  if (this->default_sample_flags_present_ == true) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," default sample flags:  ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," duration is empty ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," default base is moof");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void tfhd::print() const {
		std::cout << "=================tfhd==================" << std::endl;
		//cout << setw(33) << left << " magic conf                 " << m_magic_conf << endl;
		std::cout << std::setw(33) << std::left << " vflags                  " << flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " track id:                  " << track_id_ << std::endl;
		if (base_data_offset_present_)
			std::cout << std::setw(33) << std::left << " base_data_offset: " << base_data_offset_ << std::endl;
		if (sample_description_index_present_)
			std::cout << std::setw(33) << std::left << " sample description: " << sample_description_index_ << std::endl;
		if (default_sample_duration_present_)
			std::cout << std::setw(33) << std::left << " default sample duration: " << default_sample_duration_ << std::endl;
		if (default_sample_size_present_)
			std::cout << std::setw(33) << std::left << " default sample size: " << default_sample_size_ << std::endl;
		if (default_sample_flags_present_)
			std::cout << std::setw(33) << std::left << " default sample flags:  " << default_sample_flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " duration is empty " << duration_is_empty_ << std::endl;
		std::cout << std::setw(33) << std::left << " default base is moof" << default_base_is_moof_ << std::endl;
		//cout << "............." << std::endl;
	}